

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtcpserver.cpp
# Opt level: O0

void __thiscall QTcpServerPrivate::~QTcpServerPrivate(QTcpServerPrivate *this)

{
  QObjectPrivate *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__QTcpServerPrivate_0049c4e0;
  *(undefined ***)(in_RDI + 0x78) = &PTR__QTcpServerPrivate_0049c550;
  QNetworkProxy::~QNetworkProxy((QNetworkProxy *)0x261b72);
  QString::~QString((QString *)0x261b83);
  QHostAddress::~QHostAddress((QHostAddress *)0x261b94);
  QList<QTcpSocket_*>::~QList((QList<QTcpSocket_*> *)0x261ba5);
  QAbstractSocketEngineReceiver::~QAbstractSocketEngineReceiver
            ((QAbstractSocketEngineReceiver *)(in_RDI + 0x78));
  QObjectPrivate::~QObjectPrivate(in_RDI);
  return;
}

Assistant:

QTcpServerPrivate::~QTcpServerPrivate()
{
}